

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

void __thiscall czh::node::Node::NodeData::NodeData(NodeData *this,NodeData *nd)

{
  _Rb_tree_header *p_Var1;
  _List_node_base *p_Var2;
  int e;
  allocator<char> local_129;
  list<czh::node::Node,_std::allocator<czh::node::Node>_> *local_128;
  int local_11c;
  string local_118;
  Node local_f8;
  
  p_Var1 = &(this->index)._M_t._M_impl.super__Rb_tree_header;
  (this->index)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->index)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->index)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->index)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->index)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128 = &this->nodes;
  (this->nodes).super__List_base<czh::node::Node,_std::allocator<czh::node::Node>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)local_128;
  (this->nodes).super__List_base<czh::node::Node,_std::allocator<czh::node::Node>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)local_128;
  (this->nodes).super__List_base<czh::node::Node,_std::allocator<czh::node::Node>_>._M_impl._M_node.
  _M_size = 0;
  p_Var2 = (_List_node_base *)&nd->nodes;
  while (p_Var2 = (((_List_base<czh::node::Node,_std::allocator<czh::node::Node>_> *)
                   &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&nd->nodes) {
    Node(&local_f8,(Node *)(p_Var2 + 1));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_129);
    add(this,&local_f8,&local_118,&local_11c);
    std::__cxx11::string::~string((string *)&local_118);
    ~Node(&local_f8);
  }
  return;
}

Assistant:

NodeData(const NodeData &nd)
      {
        for (auto &r: nd.nodes)
        {
          int e;
          add(Node(r), "", e);
        }
      }